

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  Imports *this_00;
  bool bVar1;
  Import *pIVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *this_01;
  reference ppEVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  EnumVal *local_f0;
  EnumVal *val;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3;
  undefined1 local_c8 [8];
  string result;
  string local_88;
  Import *local_68;
  Import *import;
  allocator<char> local_49;
  string local_48;
  Imports *local_28;
  Imports *imports_local;
  EnumDef *enum_def_local;
  PythonStubGenerator *this_local;
  
  local_28 = imports;
  imports_local = (Imports *)enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (PythonStubGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"typing",&local_49);
  Imports::Import(imports,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = local_28;
  anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::EnumDef>
            (&local_88,(PythonStubGenerator *)this,(EnumDef *)imports_local);
  IdlNamer::Type_abi_cxx11_
            ((string *)((long)&result.field_2 + 8),(IdlNamer *)(this + 8),(EnumDef *)imports_local);
  pIVar2 = Imports::Import(this_00,&local_88,(string *)((long)&result.field_2 + 8));
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_88);
  local_68 = pIVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"",(allocator<char> *)((long)&__range3 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  this_01 = EnumDef::Vals((EnumDef *)imports_local);
  __end3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (this_01);
  val = (EnumVal *)
        std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                *)&val);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&__end3);
    local_f0 = *ppEVar3;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_c8,", ");
    }
    std::operator+(&local_130,&local_68->name,".");
    IdlNamer::Variant_abi_cxx11_(&local_150,(IdlNamer *)(this + 8),local_f0);
    std::operator+(&local_110,&local_130,&local_150);
    std::__cxx11::string::operator+=((string *)local_c8,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&__end3);
  }
  std::operator+(&local_170,"typing.Literal[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(__return_storage_ptr__,&local_170,"]");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }